

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BooPHF.h
# Opt level: O1

void * boomphf::
       thread_processLevel<unsigned_long,boomphf::SingleHashFunctor<unsigned_long>,std::vector<unsigned_long,std::allocator<unsigned_long>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                 (void *args)

{
  pthread_mutex_t *__mutex;
  int i;
  mphf<unsigned_long,boomphf::SingleHashFunctor<unsigned_long>> *pmVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> buffer;
  shared_ptr<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  local_70;
  shared_ptr<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  local_60;
  mphf<unsigned_long,boomphf::SingleHashFunctor<unsigned_long>> *local_50;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  if (args != (void *)0x0) {
    pmVar1 = *args;
    i = *(int *)((long)args + 0x30);
    local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(&local_48,10000);
    __mutex = (pthread_mutex_t *)(pmVar1 + 0x268);
    local_50 = pmVar1;
    pthread_mutex_lock(__mutex);
    local_60.
    super___shared_ptr<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = *(element_type **)((long)args + 0x10);
    this = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)args + 0x18);
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this->_M_use_count = this->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this->_M_use_count = this->_M_use_count + 1;
      }
    }
    peVar2 = *(element_type **)((long)args + 0x20);
    this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)args + 0x28);
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    pthread_mutex_unlock(__mutex);
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this->_M_use_count = this->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this->_M_use_count = this->_M_use_count + 1;
      }
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    local_70.
    super___shared_ptr<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = peVar2;
    local_70.
    super___shared_ptr<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = this_00;
    local_60.
    super___shared_ptr<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = this;
    mphf<unsigned_long,boomphf::SingleHashFunctor<unsigned_long>>::
    pthread_processLevel<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
              (local_50,&local_48,&local_60,&local_70,i);
    if (local_70.
        super___shared_ptr<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_70.
                 super___shared_ptr<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if (local_60.
        super___shared_ptr<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_60.
                 super___shared_ptr<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
    }
    if (local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return (void *)0x0;
}

Assistant:

void * thread_processLevel(void * args)
	{
		if(args ==NULL) return NULL;

		thread_args<Range,it_type> *targ = (thread_args<Range,it_type>*) args;

		mphf<elem_t, Hasher_t>  * obw = (mphf<elem_t, Hasher_t > *) targ->boophf;
		int level = targ->level;
		std::vector<elem_t> buffer;
		buffer.resize(NBBUFF);
		
		pthread_mutex_t * mutex =  & obw->_mutex;

		pthread_mutex_lock(mutex); // from comment above: "//get starting iterator for this thread, must be protected (must not be currently used by other thread to copy elems in buff)"
        std::shared_ptr<it_type> startit = std::static_pointer_cast<it_type>(targ->it_p);
        std::shared_ptr<it_type> until_p = std::static_pointer_cast<it_type>(targ->until_p);
		pthread_mutex_unlock(mutex);

		obw->pthread_processLevel(buffer, startit, until_p, level);

		return NULL;
	}